

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void PathBezierQuadraticCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float tess_tol,int level)

{
  ImVec2 *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float x3_00;
  float y3_00;
  float fVar6;
  
  fVar4 = x3 - x1;
  fVar5 = y3 - y1;
  fVar6 = (x2 - x3) * fVar5 - (y2 - y3) * fVar4;
  if ((fVar4 * fVar4 + fVar5 * fVar5) * tess_tol <= fVar6 * fVar6 * 4.0) {
    iVar3 = 10;
    if (10 < level) {
      iVar3 = level;
    }
    iVar2 = level + 1;
    do {
      if (iVar2 - iVar3 == 1) {
        return;
      }
      fVar4 = (x1 + x2) * 0.5;
      x2 = (x3 + x2) * 0.5;
      fVar5 = (y1 + y2) * 0.5;
      y2 = (y3 + y2) * 0.5;
      x3_00 = (fVar4 + x2) * 0.5;
      y3_00 = (fVar5 + y2) * 0.5;
      PathBezierQuadraticCurveToCasteljau(path,x1,y1,fVar4,fVar5,x3_00,y3_00,tess_tol,iVar2);
      fVar4 = x3 - x3_00;
      fVar5 = y3 - y3_00;
      fVar6 = (x2 - x3) * fVar5 - (y2 - y3) * fVar4;
      iVar2 = iVar2 + 1;
      x1 = x3_00;
      y1 = y3_00;
    } while ((fVar4 * fVar4 + fVar5 * fVar5) * tess_tol <= fVar6 * fVar6 * 4.0);
  }
  iVar3 = path->Size;
  if (iVar3 == path->Capacity) {
    if (iVar3 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar3 / 2 + iVar3;
    }
    iVar1 = iVar3 + 1;
    if (iVar3 + 1 < iVar2) {
      iVar1 = iVar2;
    }
    __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar1 << 3);
    if (path->Data != (ImVec2 *)0x0) {
      memcpy(__dest,path->Data,(long)path->Size << 3);
      ImGui::MemFree(path->Data);
    }
    path->Data = __dest;
    path->Capacity = iVar1;
    iVar3 = path->Size;
  }
  else {
    __dest = path->Data;
  }
  __dest[iVar3].x = x3;
  __dest[iVar3].y = y3;
  path->Size = path->Size + 1;
  return;
}

Assistant:

static void PathBezierQuadraticCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float tess_tol, int level)
{
    float dx = x3 - x1, dy = y3 - y1;
    float det = (x2 - x3) * dy - (y2 - y3) * dx;
    if (det * det * 4.0f < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x3, y3));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        PathBezierQuadraticCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, tess_tol, level + 1);
        PathBezierQuadraticCurveToCasteljau(path, x123, y123, x23, y23, x3, y3, tess_tol, level + 1);
    }
}